

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserBase.cpp
# Opt level: O0

SourceLocation __thiscall slang::parsing::ParserBase::getLastLocation(ParserBase *this)

{
  bool bVar1;
  unsigned_long in_RDI;
  ParserBase *in_stack_ffffffffffffffb8;
  SourceLocation *this_00;
  Token in_stack_ffffffffffffffc8;
  string_view local_28;
  SourceLocation local_18;
  SourceLocation local_8;
  
  bVar1 = Token::operator_cast_to_bool((Token *)0x34fee0);
  if (bVar1) {
    local_18 = Token::location((Token *)(in_RDI + 0x28));
    this_00 = in_stack_ffffffffffffffc8._0_8_;
    local_28 = Token::rawText((Token *)in_stack_ffffffffffffffc8.info);
    std::basic_string_view<char,_std::char_traits<char>_>::length(&local_28);
    local_8 = SourceLocation::operator+<unsigned_long>(this_00,in_RDI);
  }
  else {
    peek(in_stack_ffffffffffffffb8);
    local_8 = Token::location((Token *)&stack0xffffffffffffffc8);
  }
  return local_8;
}

Assistant:

SourceLocation ParserBase::getLastLocation() {
    if (window.lastConsumed)
        return window.lastConsumed.location() + window.lastConsumed.rawText().length();

    return peek().location();
}